

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

void Abc_NtkFillTruthStore(word (*TruthStore) [1024])

{
  byte bVar1;
  ulong uVar2;
  int local_20;
  int local_1c;
  int k;
  int i;
  int nWordsMax;
  int nVarsMax;
  word (*TruthStore_local) [1024];
  
  if ((*TruthStore)[0] == 0) {
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 0x400; local_20 = local_20 + 1) {
        TruthStore[local_1c][local_20] = Abc_NtkFillTruthStore::Truth6[local_1c];
      }
    }
    for (local_1c = 6; local_1c < 0x10; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < 0x400; local_20 = local_20 + 1) {
        bVar1 = (char)local_1c - 6U & 0x1f;
        uVar2 = (ulong)(uint)(0 >> bVar1);
        if ((local_20 >> bVar1 & 1U) != 0) {
          uVar2 = 0xffffffffffffffff;
        }
        TruthStore[local_1c][local_20] = uVar2;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkFillTruthStore( word TruthStore[16][1<<10] )
{
    if ( TruthStore[0][0] == 0 )
    {
        static word Truth6[6] = {
            0xAAAAAAAAAAAAAAAA,
            0xCCCCCCCCCCCCCCCC,
            0xF0F0F0F0F0F0F0F0,
            0xFF00FF00FF00FF00,
            0xFFFF0000FFFF0000,
            0xFFFFFFFF00000000
        };
        int nVarsMax = 16;
        int nWordsMax = (1 << 10);
        int i, k;
        assert( nVarsMax <= 16 );
        for ( i = 0; i < 6; i++ )
            for ( k = 0; k < nWordsMax; k++ )
                TruthStore[i][k] = Truth6[i];
        for ( i = 6; i < nVarsMax; i++ )
            for ( k = 0; k < nWordsMax; k++ )
                TruthStore[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
    }
}